

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O0

Error __thiscall asmjit::CodeHolder::newLabelId(CodeHolder *this,uint32_t *idOut)

{
  int *in_RSI;
  ZoneHeap *in_RDI;
  uint32_t id;
  LabelEntry *le;
  Error _err;
  size_t index;
  size_t allocatedSize;
  char *in_stack_00000300;
  int in_stack_0000030c;
  char *in_stack_00000310;
  uint in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  Slot **sizeOfT;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  Slot *local_c0;
  Error local_b4;
  Slot *local_b0;
  int *local_a8;
  Error local_94;
  Slot **local_88;
  undefined8 local_80;
  Slot **local_78;
  Slot **local_70;
  undefined8 local_68;
  Slot **local_60;
  int local_58;
  int local_54;
  Slot *local_50;
  Slot **local_48;
  Slot **local_40;
  undefined8 local_38;
  Slot **local_30;
  Slot **local_28;
  undefined8 local_18;
  Slot **local_10;
  Slot **local_8;
  
  *in_RSI = 0;
  local_88 = in_RDI[2]._slots + 6;
  local_b0 = in_RDI[2]._slots[7];
  if (local_b0 < (Slot *)0xffffff00) {
    sizeOfT = in_RDI[2]._slots + 6;
    local_78 = in_RDI[1]._slots + 3;
    local_80 = 1;
    local_a8 = in_RSI;
    local_70 = sizeOfT;
    if (in_RDI[2]._slots[8] == in_RDI[2]._slots[7]) {
      local_38 = 1;
      local_30 = local_78;
      local_28 = sizeOfT;
      local_b4 = ZoneVectorBase::_grow
                           ((ZoneVectorBase *)
                            CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),in_RDI,
                            (size_t)sizeOfT,
                            CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    }
    else {
      local_b4 = 0;
    }
    local_94 = local_b4;
    if (local_b4 == 0) {
      local_60 = in_RDI[1]._slots + 3;
      local_68 = 0x40;
      local_18 = 0x40;
      local_10 = local_60;
      local_8 = local_60;
      if (*local_60 == (Slot *)0x0) {
        DebugUtils::assertionFailed(in_stack_00000310,in_stack_0000030c,in_stack_00000300);
      }
      local_c0 = (Slot *)ZoneHeap::_allocZeroed
                                   (in_RDI,(size_t)sizeOfT,
                                    (size_t *)(ulong)in_stack_ffffffffffffff20);
      if (local_c0 == (Slot *)0x0) {
        local_94 = 1;
      }
      else {
        local_58 = (int)local_b0;
        local_54 = local_58 + 0x100;
        *(int *)((long)&local_c0[1].next + 4) = local_54;
        *(undefined4 *)((long)&local_c0[2].next + 4) = 0;
        *(undefined4 *)&local_c0[3].next = 0xffffffff;
        local_c0[4].next = (Slot *)0x0;
        local_40 = in_RDI[2]._slots + 6;
        local_48 = &local_c0;
        if (in_RDI[2]._slots[8] <= in_RDI[2]._slots[7]) {
          local_50 = local_c0;
          DebugUtils::assertionFailed(in_stack_00000310,in_stack_0000030c,in_stack_00000300);
        }
        (*local_40)[(long)in_RDI[2]._slots[7]].next = local_c0;
        in_RDI[2]._slots[7] = (Slot *)((long)&in_RDI[2]._slots[7]->next + 1);
        *local_a8 = local_54;
        local_94 = 0;
      }
    }
  }
  else {
    local_94 = 0xd;
  }
  return local_94;
}

Assistant:

Error CodeHolder::newLabelId(uint32_t& idOut) noexcept {
  idOut = 0;

  size_t index = _labels.getLength();
  if (ASMJIT_LIKELY(index >= Operand::kPackedIdCount))
    return DebugUtils::errored(kErrorLabelIndexOverflow);

  ASMJIT_PROPAGATE(_labels.willGrow(&_baseHeap));
  LabelEntry* le = _baseHeap.allocZeroedT<LabelEntry>();

  if (ASMJIT_UNLIKELY(!le))
    return DebugUtils::errored(kErrorNoHeapMemory);;

  uint32_t id = Operand::packId(static_cast<uint32_t>(index));
  le->_setId(id);
  le->_parentId = 0;
  le->_sectionId = SectionEntry::kInvalidId;
  le->_offset = 0;

  _labels.appendUnsafe(le);
  idOut = id;
  return kErrorOk;
}